

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

vector<boost::any,_std::allocator<boost::any>_> *
trial::dynamic::convert::
overloader<std::vector<boost::any,_std::allocator<boost::any>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
::into(vector<boost::any,_std::allocator<boost::any>_> *__return_storage_ptr__,variable_type *input,
      error_code *error)

{
  bool bVar1;
  char cVar2;
  value_type local_98;
  any value;
  basic_variable<std::allocator<char>_> *entry;
  undefined1 local_80 [8];
  const_iterator __end0;
  undefined1 local_58 [8];
  const_iterator __begin0;
  variable_type *__range3;
  vector<boost::any,_std::allocator<boost::any>_> result;
  error_code *error_local;
  variable_type *input_local;
  
  result.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)error;
  std::vector<boost::any,_std::allocator<boost::any>_>::vector
            ((vector<boost::any,_std::allocator<boost::any>_> *)&__range3);
  __begin0.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = input;
  basic_variable<std::allocator<char>_>::begin((const_iterator *)local_58,input);
  basic_variable<std::allocator<char>_>::end
            ((const_iterator *)local_80,
             (basic_variable<std::allocator<char>_> *)
             __begin0.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_);
  while (bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                           ((const_iterator *)local_58,(const_iterator *)local_80), bVar1) {
    value.content =
         (placeholder *)
         basic_variable<std::allocator<char>_>::const_iterator::operator*
                   ((const_iterator *)local_58);
    into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
              ((convert *)&local_98,(basic_variable<std::allocator<char>_> *)value.content,
               (error_code *)
               result.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    cVar2 = std::error_code::operator_cast_to_bool
                      ((error_code *)
                       result.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if ((bool)cVar2) {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<boost::any,_std::allocator<boost::any>_>::vector(__return_storage_ptr__);
    }
    else {
      std::vector<boost::any,_std::allocator<boost::any>_>::push_back
                ((vector<boost::any,_std::allocator<boost::any>_> *)&__range3,&local_98);
    }
    boost::any::~any(&local_98);
    if ((bool)cVar2) goto LAB_0014ce51;
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_58);
  }
  cVar2 = '\x02';
LAB_0014ce51:
  basic_variable<std::allocator<char>_>::const_iterator::~const_iterator((const_iterator *)local_80)
  ;
  basic_variable<std::allocator<char>_>::const_iterator::~const_iterator((const_iterator *)local_58)
  ;
  if (cVar2 == '\x02') {
    std::vector<boost::any,_std::allocator<boost::any>_>::vector
              (__return_storage_ptr__,(vector<boost::any,_std::allocator<boost::any>_> *)&__range3);
  }
  std::vector<boost::any,_std::allocator<boost::any>_>::~vector
            ((vector<boost::any,_std::allocator<boost::any>_> *)&__range3);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<boost::any> into(const variable_type& input,
                                        std::error_code& error)
    {
        std::vector<boost::any> result;
        for (const auto& entry : input)
        {
            auto value = convert::into<boost::any>(entry, error);
            if (error)
                return {};

            result.push_back(std::move(value));
        }
        return result;
    }